

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O3

uint64_t aom_sum_squares_2d_i16_nxn_avx2(int16_t *src,int stride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [32];
  int iVar6;
  long lVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  
  if (height < 1) {
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar6 = 0;
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar10 = ZEXT1664((undefined1  [16])0x0);
      auVar9 = auVar10._0_32_;
      if (0 < width) {
        lVar7 = 0;
        pauVar5 = (undefined1 (*) [32])src;
        do {
          auVar9 = vpmaddwd_avx2(*pauVar5,*pauVar5);
          auVar9 = vpaddd_avx2(auVar9,auVar10._0_32_);
          auVar3 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)stride * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)stride * 2));
          auVar4 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)(stride * 2) * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)(stride * 2) * 2));
          auVar3 = vpaddd_avx2(auVar3,auVar4);
          auVar9 = vpaddd_avx2(auVar9,auVar3);
          auVar3 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)(stride * 3) * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)(stride * 3) * 2));
          auVar9 = vpaddd_avx2(auVar9,auVar3);
          auVar10 = ZEXT3264(auVar9);
          lVar7 = lVar7 + 0x10;
          pauVar5 = pauVar5 + 1;
        } while (lVar7 < width);
      }
      auVar3 = vpblendd_avx2(auVar9,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
      auVar3 = vpaddq_avx2(auVar3,auVar8._0_32_);
      auVar9 = vpsrlq_avx2(auVar9,0x20);
      auVar9 = vpaddq_avx2(auVar3,auVar9);
      auVar8 = ZEXT3264(auVar9);
      iVar6 = iVar6 + 4;
      src = (int16_t *)(*(undefined1 (*) [32])src + (long)(stride * 4) * 2);
    } while (iVar6 < height);
  }
  auVar1 = vpaddq_avx(auVar9._0_16_,auVar9._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar2,auVar1);
  return auVar1._0_8_;
}

Assistant:

static uint64_t aom_sum_squares_2d_i16_nxn_avx2(const int16_t *src, int stride,
                                                int width, int height) {
  uint64_t result;
  __m256i v_acc_q = _mm256_setzero_si256();
  const __m256i v_zext_mask_q = _mm256_set1_epi64x(~0u);
  for (int col = 0; col < height; col += 4) {
    __m256i v_acc_d = _mm256_setzero_si256();
    for (int row = 0; row < width; row += 16) {
      const int16_t *tempsrc = src + row;
      const __m256i v_val_0_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 0 * stride));
      const __m256i v_val_1_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 1 * stride));
      const __m256i v_val_2_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 2 * stride));
      const __m256i v_val_3_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 3 * stride));

      const __m256i v_sq_0_d = _mm256_madd_epi16(v_val_0_w, v_val_0_w);
      const __m256i v_sq_1_d = _mm256_madd_epi16(v_val_1_w, v_val_1_w);
      const __m256i v_sq_2_d = _mm256_madd_epi16(v_val_2_w, v_val_2_w);
      const __m256i v_sq_3_d = _mm256_madd_epi16(v_val_3_w, v_val_3_w);

      const __m256i v_sum_01_d = _mm256_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m256i v_sum_23_d = _mm256_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m256i v_sum_0123_d = _mm256_add_epi32(v_sum_01_d, v_sum_23_d);

      v_acc_d = _mm256_add_epi32(v_acc_d, v_sum_0123_d);
    }
    v_acc_q =
        _mm256_add_epi64(v_acc_q, _mm256_and_si256(v_acc_d, v_zext_mask_q));
    v_acc_q = _mm256_add_epi64(v_acc_q, _mm256_srli_epi64(v_acc_d, 32));
    src += 4 * stride;
  }
  __m128i lower_64_2_Value = _mm256_castsi256_si128(v_acc_q);
  __m128i higher_64_2_Value = _mm256_extracti128_si256(v_acc_q, 1);
  __m128i result_64_2_int = _mm_add_epi64(lower_64_2_Value, higher_64_2_Value);

  result_64_2_int = _mm_add_epi64(
      result_64_2_int, _mm_unpackhi_epi64(result_64_2_int, result_64_2_int));

  xx_storel_64(&result, result_64_2_int);

  return result;
}